

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O1

int mqttmessage_getTopicLevels(MQTT_MESSAGE_HANDLE handle,char ***levels,size_t *count)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t length;
  int iVar3;
  char *pcVar4;
  char *delimiters [1];
  
  if ((levels == (char ***)0x0 || handle == (MQTT_MESSAGE_HANDLE)0x0) || count == (size_t *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xe1;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
              ,"mqttmessage_getTopicLevels",0xe0,1,
              "Invalid Parameter handle: %p, levels: %p, count: %p",handle,levels,count);
    return 0xe1;
  }
  pcVar4 = handle->topicName;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = handle->const_topic_name;
  }
  if (pcVar4 == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xec;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xec;
    }
    pcVar4 = "Topic name is NULL";
    iVar3 = 0xeb;
  }
  else {
    delimiters[0] = "/";
    length = strlen(pcVar4);
    iVar1 = StringToken_Split(pcVar4,length,delimiters,1,false,levels,count);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xfa;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xfa;
    }
    pcVar4 = "Failed splitting topic levels";
    iVar3 = 0xf9;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
            ,"mqttmessage_getTopicLevels",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int mqttmessage_getTopicLevels(MQTT_MESSAGE_HANDLE handle, char*** levels, size_t* count)
{
    int result;

    // Codes_SRS_MQTTMESSAGE_09_001: [ If `handle`, `levels` or `count` are NULL the function shall return a non-zero value. ]
    if (handle == NULL || levels == NULL || count == NULL)
    {
        LogError("Invalid Parameter handle: %p, levels: %p, count: %p", handle, levels, count);
        result = MU_FAILURE;
    }
    else
    {
        MQTT_MESSAGE* msgInfo = (MQTT_MESSAGE*)handle;

        const char* topic_name = msgInfo->topicName != NULL ? msgInfo->topicName : msgInfo->const_topic_name;

        if (topic_name == NULL)
        {
            LogError("Topic name is NULL");
            result = MU_FAILURE;
        }
        else
        {
            const char* delimiters[1];

            delimiters[0] = "/";

            // Codes_SRS_MQTTMESSAGE_09_002: [ The topic name, excluding the property bag, shall be split into individual tokens using "/" as separator ]
            // Codes_SRS_MQTTMESSAGE_09_004: [ The split tokens shall be stored in `levels` and its count in `count` ]
            if (StringToken_Split(topic_name, strlen(topic_name), delimiters, 1, false, levels, count) != 0)
            {
                // Codes_SRS_MQTTMESSAGE_09_003: [ If splitting fails the function shall return a non-zero value. ]
                LogError("Failed splitting topic levels");
                result = MU_FAILURE;
            }
            else
            {
                // Codes_SRS_MQTTMESSAGE_09_005: [ If no failures occur the function shall return zero. ]
                result = 0;
            }
        }
    }

    return result;
}